

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O1

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::left4(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int n,SPxId id)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  int iVar4;
  double *pdVar5;
  undefined8 uVar6;
  long lVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhov_1;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1e8;
  pointer local_1e0;
  cpp_dec_float<50U,_int,_void> local_1d8;
  cpp_dec_float<50U,_int,_void> local_198;
  cpp_dec_float<50U,_int,_void> local_158;
  long local_118;
  double local_110;
  long local_108;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_100;
  pointer local_f8;
  pointer local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (id.super_DataKey.info != 0) {
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 10;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems._24_5_ = 0;
    local_a8.data._M_elems[7]._1_3_ = 0;
    local_a8.data._M_elems._32_5_ = 0;
    local_a8.data._M_elems[9]._1_3_ = 0;
    local_a8.exp = 0;
    local_a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_a8,
               1.0 / (double)(((this->
                               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).thesolver)->
                             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).iterCount + 0.1);
    pSVar2 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_f0 = (this->workVec).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_1e0 = (pSVar2->coWeights).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_f8 = (pSVar2->theFvec->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_118 = (long)n * 0x38;
    pcVar9 = &local_f8[n].m_backend;
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68.data._M_elems[9]._1_3_ = 0;
    local_68.exp = 0;
    local_68.neg = false;
    local_268.fpclass = cpp_dec_float_finite;
    local_268.prec_elem = 10;
    local_268.data._M_elems[0] = 0;
    local_268.data._M_elems[1] = 0;
    local_268.data._M_elems[2] = 0;
    local_268.data._M_elems[3] = 0;
    local_268.data._M_elems[4] = 0;
    local_268.data._M_elems[5] = 0;
    local_268.data._M_elems._24_5_ = 0;
    local_268.data._M_elems[7]._1_3_ = 0;
    local_268.data._M_elems._32_5_ = 0;
    local_268.data._M_elems[9]._1_3_ = 0;
    local_268.exp = 0;
    local_268.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_268,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_68,&local_268,pcVar9);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::length2((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_228,
              &((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->theCoPvec->thedelta);
    local_268.data._M_elems[0] = local_228.data._M_elems[0];
    local_268.data._M_elems[1] = local_228.data._M_elems[1];
    local_268.data._M_elems[2] = local_228.data._M_elems[2];
    local_268.data._M_elems[3] = local_228.data._M_elems[3];
    local_268.data._M_elems[4] = local_228.data._M_elems[4];
    local_268.data._M_elems[5] = local_228.data._M_elems[5];
    local_268.data._M_elems._24_5_ = local_228.data._M_elems._24_5_;
    local_268.data._M_elems[7]._1_3_ = local_228.data._M_elems[7]._1_3_;
    local_268.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
    local_268.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
    local_268.exp = local_228.exp;
    local_268.neg = local_228.neg;
    local_268.fpclass = local_228.fpclass;
    local_268.prec_elem = local_228.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_268,&local_68)
    ;
    local_158.data._M_elems[7]._1_3_ = local_268.data._M_elems[7]._1_3_;
    local_158.data._M_elems._24_5_ = local_268.data._M_elems._24_5_;
    local_158.data._M_elems[0] = local_268.data._M_elems[0];
    local_158.data._M_elems[1] = local_268.data._M_elems[1];
    local_158.data._M_elems[2] = local_268.data._M_elems[2];
    local_158.data._M_elems[3] = local_268.data._M_elems[3];
    local_158.data._M_elems[4] = local_268.data._M_elems[4];
    local_158.data._M_elems[5] = local_268.data._M_elems[5];
    local_158.data._M_elems[9]._1_3_ = local_268.data._M_elems[9]._1_3_;
    local_158.data._M_elems._32_5_ = local_268.data._M_elems._32_5_;
    local_158.exp = local_268.exp;
    local_158.neg = local_268.neg;
    local_158.fpclass = local_268.fpclass;
    local_158.prec_elem = local_268.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_158,&local_68)
    ;
    local_100 = ((this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theFvec;
    local_108 = (long)(local_100->thedelta).super_IdxSet.num;
    if (0 < local_108) {
      local_1e8 = this;
      pdVar5 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_110 = *pdVar5;
      local_1e8 = (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&(local_1e8->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thetolerance;
      lVar7 = 0;
      do {
        iVar4 = (local_100->thedelta).super_IdxSet.idx[lVar7];
        pcVar9 = &local_f8[iVar4].m_backend;
        local_1d8.fpclass = cpp_dec_float_finite;
        local_1d8.prec_elem = 10;
        local_1d8.data._M_elems[0] = 0;
        local_1d8.data._M_elems[1] = 0;
        local_1d8.data._M_elems[2] = 0;
        local_1d8.data._M_elems[3] = 0;
        local_1d8.data._M_elems[4] = 0;
        local_1d8.data._M_elems[5] = 0;
        local_1d8.data._M_elems._24_5_ = 0;
        local_1d8.data._M_elems[7]._1_3_ = 0;
        local_1d8.data._M_elems._32_5_ = 0;
        local_1d8.data._M_elems[9]._1_3_ = 0;
        local_1d8.exp = 0;
        local_1d8.neg = false;
        pcVar8 = &local_158;
        if (&local_1d8 != pcVar9) {
          local_1d8.data._M_elems._32_5_ = local_158.data._M_elems._32_5_;
          local_1d8.data._M_elems[9]._1_3_ = local_158.data._M_elems[9]._1_3_;
          local_1d8.data._M_elems[4] = local_158.data._M_elems[4];
          local_1d8.data._M_elems[5] = local_158.data._M_elems[5];
          local_1d8.data._M_elems._24_5_ = local_158.data._M_elems._24_5_;
          local_1d8.data._M_elems[7]._1_3_ = local_158.data._M_elems[7]._1_3_;
          local_1d8.data._M_elems[0] = local_158.data._M_elems[0];
          local_1d8.data._M_elems[1] = local_158.data._M_elems[1];
          local_1d8.data._M_elems[2] = local_158.data._M_elems[2];
          local_1d8.data._M_elems[3] = local_158.data._M_elems[3];
          local_1d8.exp = local_158.exp;
          local_1d8.neg = local_158.neg;
          local_1d8.fpclass = local_158.fpclass;
          local_1d8.prec_elem = local_158.prec_elem;
          pcVar8 = pcVar9;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_1d8,pcVar8);
        local_198.fpclass = cpp_dec_float_finite;
        local_198.prec_elem = 10;
        local_198.data._M_elems[0] = 0;
        local_198.data._M_elems[1] = 0;
        local_198.data._M_elems[2] = 0;
        local_198.data._M_elems[3] = 0;
        local_198.data._M_elems[4] = 0;
        local_198.data._M_elems[5] = 0;
        local_198.data._M_elems._24_5_ = 0;
        local_198.data._M_elems[7]._1_3_ = 0;
        local_198.data._M_elems._32_5_ = 0;
        local_198.data._M_elems[9]._1_3_ = 0;
        local_198.exp = 0;
        local_198.neg = false;
        local_268.fpclass = cpp_dec_float_finite;
        local_268.prec_elem = 10;
        local_268.data._M_elems[0] = 0;
        local_268.data._M_elems[1] = 0;
        local_268.data._M_elems[2] = 0;
        local_268.data._M_elems[3] = 0;
        local_268.data._M_elems[4] = 0;
        local_268.data._M_elems[5] = 0;
        local_268.data._M_elems._24_5_ = 0;
        local_268.data._M_elems[7]._1_3_ = 0;
        local_268.data._M_elems._32_5_ = 0;
        local_268.data._M_elems[9]._1_3_ = 0;
        local_268.exp = 0;
        local_268.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_268,2.0);
        local_198.data._M_elems[0] = local_68.data._M_elems[0];
        local_198.data._M_elems[1] = local_68.data._M_elems[1];
        local_198.data._M_elems[2] = local_68.data._M_elems[2];
        local_198.data._M_elems[3] = local_68.data._M_elems[3];
        local_198.data._M_elems[4] = local_68.data._M_elems[4];
        local_198.data._M_elems[5] = local_68.data._M_elems[5];
        local_198.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
        local_198.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
        local_198.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
        local_198.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
        local_198.exp = local_68.exp;
        local_198.neg = local_68.neg;
        local_198.fpclass = local_68.fpclass;
        local_198.prec_elem = local_68.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_198,&local_268);
        local_e8.fpclass = cpp_dec_float_finite;
        local_e8.prec_elem = 10;
        local_e8.data._M_elems[0] = 0;
        local_e8.data._M_elems[1] = 0;
        local_e8.data._M_elems[2] = 0;
        local_e8.data._M_elems[3] = 0;
        local_e8.data._M_elems[4] = 0;
        local_e8.data._M_elems[5] = 0;
        local_e8.data._M_elems._24_5_ = 0;
        local_e8.data._M_elems[7]._1_3_ = 0;
        local_e8.data._M_elems._32_5_ = 0;
        local_e8.data._M_elems[9]._1_3_ = 0;
        local_e8.exp = 0;
        local_e8.neg = false;
        pcVar8 = &local_198;
        if (&local_e8 != &local_f0[iVar4].m_backend) {
          local_e8.data._M_elems._32_5_ = local_198.data._M_elems._32_5_;
          local_e8.data._M_elems[9]._1_3_ = local_198.data._M_elems[9]._1_3_;
          local_e8.data._M_elems[4] = local_198.data._M_elems[4];
          local_e8.data._M_elems[5] = local_198.data._M_elems[5];
          local_e8.data._M_elems._24_5_ = local_198.data._M_elems._24_5_;
          local_e8.data._M_elems[7]._1_3_ = local_198.data._M_elems[7]._1_3_;
          local_e8.data._M_elems[0] = local_198.data._M_elems[0];
          local_e8.data._M_elems[1] = local_198.data._M_elems[1];
          local_e8.data._M_elems[2] = local_198.data._M_elems[2];
          local_e8.data._M_elems[3] = local_198.data._M_elems[3];
          local_e8.exp = local_198.exp;
          local_e8.neg = local_198.neg;
          local_e8.fpclass = local_198.fpclass;
          local_e8.prec_elem = local_198.prec_elem;
          pcVar8 = &local_f0[iVar4].m_backend;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_e8,pcVar8)
        ;
        local_228.data._M_elems._32_5_ = local_1d8.data._M_elems._32_5_;
        local_228.data._M_elems[9]._1_3_ = local_1d8.data._M_elems[9]._1_3_;
        local_228.data._M_elems[4] = local_1d8.data._M_elems[4];
        local_228.data._M_elems[5] = local_1d8.data._M_elems[5];
        local_228.data._M_elems._24_5_ = local_1d8.data._M_elems._24_5_;
        local_228.data._M_elems[7]._1_3_ = local_1d8.data._M_elems[7]._1_3_;
        local_228.data._M_elems[0] = local_1d8.data._M_elems[0];
        local_228.data._M_elems[1] = local_1d8.data._M_elems[1];
        local_228.data._M_elems[2] = local_1d8.data._M_elems[2];
        local_228.data._M_elems[3] = local_1d8.data._M_elems[3];
        local_228.exp = local_1d8.exp;
        local_228.neg = local_1d8.neg;
        local_228.fpclass = local_1d8.fpclass;
        local_228.prec_elem = local_1d8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_228,&local_e8);
        local_268.fpclass = cpp_dec_float_finite;
        local_268.prec_elem = 10;
        local_268.data._M_elems[0] = 0;
        local_268.data._M_elems[1] = 0;
        local_268.data._M_elems[2] = 0;
        local_268.data._M_elems[3] = 0;
        local_268.data._M_elems[4] = 0;
        local_268.data._M_elems[5] = 0;
        local_268.data._M_elems._24_5_ = 0;
        local_268.data._M_elems[7]._1_3_ = 0;
        local_268.data._M_elems._32_5_ = 0;
        local_268.data._M_elems[9]._1_3_ = 0;
        local_268.exp = 0;
        local_268.neg = false;
        if (&local_268 != pcVar9) {
          uVar6 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
          local_268.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_268.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_268.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
          local_268.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
          local_268.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
          uVar6 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
          local_268.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_268.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_268.exp = pcVar9->exp;
          local_268.neg = pcVar9->neg;
          local_268.fpclass = pcVar9->fpclass;
          local_268.prec_elem = pcVar9->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_268,&local_228);
        pnVar3 = local_1e0;
        pcVar9 = &local_1e0[iVar4].m_backend;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (pcVar9,&local_268);
        if (((pnVar3[iVar4].m_backend.fpclass == cpp_dec_float_NaN) ||
            (local_a8.fpclass == cpp_dec_float_NaN)) ||
           (iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar9,&local_a8), -1 < iVar4)) {
          ::soplex::infinity::__tls_init();
          local_268.fpclass = cpp_dec_float_finite;
          local_268.prec_elem = 10;
          local_268.data._M_elems[0] = 0;
          local_268.data._M_elems[1] = 0;
          local_268.data._M_elems[2] = 0;
          local_268.data._M_elems[3] = 0;
          local_268.data._M_elems[4] = 0;
          local_268.data._M_elems[5] = 0;
          local_268.data._M_elems._24_5_ = 0;
          local_268.data._M_elems[7]._1_3_ = 0;
          local_268.data._M_elems._32_5_ = 0;
          local_268.data._M_elems[9]._1_3_ = 0;
          local_268.exp = 0;
          local_268.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_268,local_110);
          if (((pcVar9->fpclass != cpp_dec_float_NaN) && (local_268.fpclass != cpp_dec_float_NaN))
             && (iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar9,&local_268), -1 < iVar4)) {
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems._32_5_ = 0;
            local_228.data._M_elems[9]._1_3_ = 0;
            local_228.exp = 0;
            local_228.neg = false;
            local_268.fpclass = cpp_dec_float_finite;
            local_268.prec_elem = 10;
            local_268.data._M_elems[0] = 0;
            local_268.data._M_elems[1] = 0;
            local_268.data._M_elems[2] = 0;
            local_268.data._M_elems[3] = 0;
            local_268.data._M_elems[4] = 0;
            local_268.data._M_elems[5] = 0;
            local_268.data._M_elems._24_5_ = 0;
            local_268.data._M_elems[7]._1_3_ = 0;
            local_268.data._M_elems._32_5_ = 0;
            local_268.data._M_elems[9]._1_3_ = 0;
            local_268.exp = 0;
            local_268.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_268,1.0);
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_228,&local_268,(cpp_dec_float<50U,_int,_void> *)local_1e8);
            *(ulong *)((pcVar9->data)._M_elems + 8) =
                 CONCAT35(local_228.data._M_elems[9]._1_3_,local_228.data._M_elems._32_5_);
            *(undefined8 *)((pcVar9->data)._M_elems + 4) = local_228.data._M_elems._16_8_;
            *(ulong *)((pcVar9->data)._M_elems + 6) =
                 CONCAT35(local_228.data._M_elems[7]._1_3_,local_228.data._M_elems._24_5_);
            *(undefined8 *)(pcVar9->data)._M_elems = local_228.data._M_elems._0_8_;
            *(undefined8 *)((pcVar9->data)._M_elems + 2) = local_228.data._M_elems._8_8_;
            pcVar9->exp = local_228.exp;
            pcVar9->neg = local_228.neg;
            uVar6 = local_228._48_8_;
            goto LAB_002c2225;
          }
        }
        else {
          *(ulong *)((pcVar9->data)._M_elems + 8) =
               CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
          *(undefined8 *)((pcVar9->data)._M_elems + 4) = local_a8.data._M_elems._16_8_;
          *(ulong *)((pcVar9->data)._M_elems + 6) =
               CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
          *(undefined8 *)(pcVar9->data)._M_elems = local_a8.data._M_elems._0_8_;
          *(undefined8 *)((pcVar9->data)._M_elems + 2) = local_a8.data._M_elems._8_8_;
          pcVar9->exp = local_a8.exp;
          pcVar9->neg = local_a8.neg;
          uVar6 = local_a8._48_8_;
LAB_002c2225:
          pcVar9->fpclass = (fpclass_type)uVar6;
          pcVar9->prec_elem = SUB84(uVar6,4);
        }
        lVar7 = lVar7 + 1;
      } while (local_108 != lVar7);
    }
    *(undefined8 *)((long)&(local_1e0->m_backend).data + local_118 + 0x20) =
         local_158.data._M_elems._32_8_;
    puVar1 = (uint *)((long)&(local_1e0->m_backend).data + local_118 + 0x10);
    *(undefined8 *)puVar1 = local_158.data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = local_158.data._M_elems._24_8_;
    puVar1 = (uint *)((long)&(local_1e0->m_backend).data + local_118);
    *(undefined8 *)puVar1 = local_158.data._M_elems._0_8_;
    *(undefined8 *)(puVar1 + 2) = local_158.data._M_elems._8_8_;
    *(int *)((long)&(local_1e0->m_backend).data + local_118 + 0x28) = local_158.exp;
    *(bool *)((long)&(local_1e0->m_backend).data + local_118 + 0x2c) = local_158.neg;
    *(undefined8 *)((long)&(local_1e0->m_backend).data + local_118 + 0x30) = local_158._48_8_;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }